

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O1

void __thiscall glslang::TSymbolTable::pop(TSymbolTable *this,TPrecisionQualifier *p)

{
  pointer ppTVar1;
  TPrecisionQualifier *pTVar2;
  TSymbolTableLevel *this_00;
  uint uVar3;
  pointer ppTVar4;
  undefined1 uVar5;
  int t;
  long lVar6;
  
  ppTVar4 = (this->table).
            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((p != (TPrecisionQualifier *)0x0) &&
     (ppTVar1 = (this->table).
                super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
     pTVar2 = ppTVar1[((long)ppTVar4 - (long)ppTVar1) * 0x20000000 + -0x100000000 >> 0x20]->
              defaultPrecision, pTVar2 != (TPrecisionQualifier *)0x0)) {
    lVar6 = 0;
    do {
      p[lVar6] = pTVar2[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x1c);
  }
  this_00 = ppTVar4[-1];
  if (this_00 != (TSymbolTableLevel *)0x0) {
    TSymbolTableLevel::~TSymbolTableLevel(this_00);
  }
  ppTVar4 = (this->table).
            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  (this->table).
  super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppTVar4;
  uVar3 = (int)((ulong)((long)ppTVar4 -
                       (long)(this->table).
                             super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
  uVar5 = 0x7f;
  if (uVar3 < 0x80) {
    uVar5 = (char)uVar3;
  }
  *(undefined1 *)((long)&this->uniqueId + 7) = uVar5;
  return;
}

Assistant:

void pop(TPrecisionQualifier *p)
    {
        table[currentLevel()]->getPreviousDefaultPrecisions(p);
        delete table.back();
        table.pop_back();
        updateUniqueIdLevelFlag();
    }